

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O1

void __thiscall ans_smsb_encode<40U>::~ans_smsb_encode(ans_smsb_encode<40U> *this)

{
  pointer peVar1;
  pointer puVar2;
  
  peVar1 = (this->table).super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (peVar1 != (pointer)0x0) {
    operator_delete(peVar1,(long)(this->table).
                                 super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)peVar1);
  }
  puVar2 = (this->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->nfreqs).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    return;
  }
  return;
}

Assistant:

static ans_smsb_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_smsb_encode model;
        std::vector<uint64_t> freqs(smsb_constants::MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32 = ans_smsb_mapping(in_u32[i]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true, H_approx);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }